

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O0

void sSetRWork(int m,int panel_size,float *dworkptr,float **dense,float **tempv)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int local_3c;
  int rowblk;
  int maxsuper;
  float zero;
  float **tempv_local;
  float **dense_local;
  float *dworkptr_local;
  int panel_size_local;
  int m_local;
  
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  if (iVar2 < iVar1) {
    local_3c = sp_ienv(3);
  }
  else {
    local_3c = sp_ienv(7);
  }
  iVar1 = sp_ienv(4);
  *dense = dworkptr;
  *tempv = *dense + panel_size * m;
  sfill(*dense,m * panel_size,0.0);
  local_4c = m;
  if (m <= (local_3c + iVar1) * panel_size) {
    local_4c = (local_3c + iVar1) * panel_size;
  }
  sfill(*tempv,local_4c,0.0);
  return;
}

Assistant:

void
sSetRWork(int m, int panel_size, float *dworkptr,
	 float **dense, float **tempv)
{
    float zero = 0.0;

    int maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
        rowblk   = sp_ienv(4);
    *dense = dworkptr;
    *tempv = *dense + panel_size*m;
    sfill (*dense, m * panel_size, zero);
    sfill (*tempv, NUM_TEMPV(m,panel_size,maxsuper,rowblk), zero);     
}